

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O3

void __thiscall
vkt::QueryPool::anon_unknown_0::OcclusionQueryTestInstance::~OcclusionQueryTestInstance
          (OcclusionQueryTestInstance *this)

{
  deInt32 *pdVar1;
  StateObjects *this_00;
  VkCommandPool obj;
  SharedPtrStateBase *pSVar2;
  VkDevice pVVar3;
  DeviceInterface *pDVar4;
  
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__OcclusionQueryTestInstance_00cfba08;
  pVVar3 = Context::getDevice((this->super_TestInstance).m_context);
  this_00 = this->m_stateObjects;
  if (this_00 != (StateObjects *)0x0) {
    StateObjects::~StateObjects(this_00);
    operator_delete(this_00,0x100);
  }
  if ((this->m_queryPool).m_internal != 0) {
    pDVar4 = Context::getDeviceInterface((this->super_TestInstance).m_context);
    (*pDVar4->_vptr_DeviceInterface[0x1f])(pDVar4,pVVar3,(this->m_queryPool).m_internal,0);
  }
  if ((this->m_copyResultsCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object !=
      (VkCommandBuffer_s *)0x0) {
    pDVar4 = (this->m_copyResultsCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
             deleter.m_deviceIface;
    (*pDVar4->_vptr_DeviceInterface[0x48])
              (pDVar4,(this->m_copyResultsCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.
                      m_data.deleter.m_device,
               (this->m_copyResultsCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
               deleter.m_pool.m_internal,1);
  }
  (this->m_copyResultsCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device
       = (VkDevice)0x0;
  (this->m_copyResultsCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
  m_internal = 0;
  (this->m_copyResultsCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)0x0;
  (this->m_copyResultsCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  if ((this->m_renderCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object !=
      (VkCommandBuffer_s *)0x0) {
    pDVar4 = (this->m_renderCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
             m_deviceIface;
    (*pDVar4->_vptr_DeviceInterface[0x48])
              (pDVar4,(this->m_renderCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                      deleter.m_device,
               (this->m_renderCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
               m_pool.m_internal,1);
  }
  (this->m_renderCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_renderCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
  m_internal = 0;
  (this->m_renderCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)0x0;
  (this->m_renderCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  if ((this->m_queryPoolResetCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object !=
      (VkCommandBuffer_s *)0x0) {
    pDVar4 = (this->m_queryPoolResetCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
             deleter.m_deviceIface;
    (*pDVar4->_vptr_DeviceInterface[0x48])
              (pDVar4,(this->m_queryPoolResetCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.
                      m_data.deleter.m_device,
               (this->m_queryPoolResetCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
               deleter.m_pool.m_internal,1);
  }
  (this->m_queryPoolResetCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_queryPoolResetCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool
  .m_internal = 0;
  (this->m_queryPoolResetCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)0x0;
  (this->m_queryPoolResetCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  obj.m_internal =
       (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
  ;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&(this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               obj);
  }
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  pSVar2 = (this->m_queryPoolResultsBuffer).m_state;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar2->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (this->m_queryPoolResultsBuffer).m_ptr = (Buffer *)0x0;
      (*((this->m_queryPoolResultsBuffer).m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &((this->m_queryPoolResultsBuffer).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      pSVar2 = (this->m_queryPoolResultsBuffer).m_state;
      if (pSVar2 != (SharedPtrStateBase *)0x0) {
        (*pSVar2->_vptr_SharedPtrStateBase[1])();
      }
      (this->m_queryPoolResultsBuffer).m_state = (SharedPtrStateBase *)0x0;
    }
  }
  return;
}

Assistant:

OcclusionQueryTestInstance::~OcclusionQueryTestInstance (void)
{
	const vk::VkDevice device = m_context.getDevice();

	if (m_stateObjects)
		delete m_stateObjects;

	if (m_queryPool != DE_NULL)
	{
		const vk::DeviceInterface& vk = m_context.getDeviceInterface();
		vk.destroyQueryPool(device, m_queryPool, /*pAllocator*/ DE_NULL);
	}
}